

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O3

void sqlcheck::CheckConcatenation(Configuration *state,string *sql_statement,bool *print_statement)

{
  string title;
  string local_90;
  string local_70;
  regex pattern;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&pattern,"\\|\\|",0x10);
  title._M_dataplus._M_p = (pointer)&title.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&title,"String Concatenation","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,title._M_dataplus._M_p,
             title._M_dataplus._M_p + title._M_string_length);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,anon_var_dwarf_d05ae,anon_var_dwarf_d05ae + 0x1cd);
  CheckPattern(state,sql_statement,print_statement,&pattern,RISK_LEVEL_LOW,PATTERN_TYPE_QUERY,
               &local_90,&local_70,true,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)title._M_dataplus._M_p != &title.field_2) {
    operator_delete(title._M_dataplus._M_p);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
  return;
}

Assistant:

void CheckConcatenation(Configuration& state,
                        const std::string& sql_statement,
                        bool& print_statement) {


  std::regex pattern("\\|\\|");
  std::string title = "String Concatenation";
  PatternType pattern_type = PatternType::PATTERN_TYPE_QUERY;

  auto message =
      "● Use COALESCE for string concatenation of nullable columns:  "
      "You may need to force a column or expression to be non-null for the sake of "
      "simplifying the query logic, but you don't want that value to be stored. "
      "Use COALESCE function to construct the concatenated expression so that a "
      "null-valued column doesn't make the whole expression become null. "
      "EX: SELECT first_name || COALESCE(' ' || middle_initial || ' ', ' ') || last_name "
      "AS full_name FROM Accounts;";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_LOW,
               pattern_type,
               title,
               message,
               true);

}